

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# point_source_panner.cpp
# Opt level: O1

optional<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> * __thiscall
ear::PointSourcePannerDownmix::handle
          (optional<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *__return_storage_ptr__,
          PointSourcePannerDownmix *this,Vector3d *position)

{
  element_type *peVar1;
  undefined1 auVar2 [16];
  Index size;
  ulong uVar3;
  ulong uVar4;
  Scalar SVar5;
  double dVar6;
  undefined1 auVar7 [16];
  VectorXd _pv;
  optional<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> pv;
  scalar_sum_op<double,_double> local_89;
  DenseStorage<double,__1,__1,_1,_0> local_88;
  char local_70 [8];
  DenseStorage<double,__1,__1,_1,_0> local_68;
  CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
  local_58;
  Product<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>
  local_48;
  double local_38;
  double dStack_30;
  double local_28;
  
  peVar1 = (this->_psp).super___shared_ptr<ear::PointSourcePanner,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  local_28 = (position->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
             m_data.array[2];
  local_38 = (position->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
             m_data.array[0];
  dStack_30 = (position->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
              m_data.array[1];
  (**peVar1->_vptr_PointSourcePanner)(local_70,peVar1,&local_38);
  if (local_70[0] == '\x01') {
    Eigen::DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage(&local_88,&local_68);
    if ((this->_downmix).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
        m_rows != local_88.m_rows) {
      __assert_fail("lhs.cols() == rhs.rows() && \"invalid matrix product\" && \"if you wanted a coeff-wise or a dot product use the respective explicit functions\""
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/ebu[P]libear/submodules/eigen/Eigen/src/Core/Product.h"
                    ,0x62,
                    "Eigen::Product<Eigen::Transpose<Eigen::Matrix<double, -1, -1>>, Eigen::Matrix<double, -1, 1>>::Product(const Lhs &, const Rhs &) [Lhs = Eigen::Transpose<Eigen::Matrix<double, -1, -1>>, Rhs = Eigen::Matrix<double, -1, 1>, Option = 0]"
                   );
    }
    local_48.m_lhs.m_matrix = &this->_downmix;
    local_48.m_rhs = (RhsNested)&local_88;
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>,Eigen::Matrix<double,_1,1,0,_1,1>,0>,Eigen::internal::assign_op<double,double>>
              ((Matrix<double,__1,_1,_0,__1,_1> *)&local_88,&local_48,
               (assign_op<double,_double> *)&local_58,(type)0x0);
    local_58.m_xpr = (XprTypeNested)&local_88;
    if (local_88.m_rows == 0) {
      SVar5 = 0.0;
    }
    else {
      if (local_88.m_rows < 1) {
        __assert_fail("this->rows()>0 && this->cols()>0 && \"you are using an empty matrix\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/ebu[P]libear/submodules/eigen/Eigen/src/Core/Redux.h"
                      ,0x19b,
                      "typename internal::traits<Derived>::Scalar Eigen::DenseBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>, const Eigen::Matrix<double, -1, 1>>>::redux(const Func &) const [Derived = Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>, const Eigen::Matrix<double, -1, 1>>, BinaryOp = Eigen::internal::scalar_sum_op<double>]"
                     );
      }
      local_48.m_rhs = (RhsNested)local_88.m_data;
      SVar5 = Eigen::internal::
              redux_impl<Eigen::internal::scalar_sum_op<double,double>,Eigen::internal::redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::Matrix<double,-1,1,0,-1,1>const>>,3,0>
              ::
              run<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>>
                        ((redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                          *)&local_48,&local_89,&local_58);
    }
    if (local_88.m_rows < 0) {
      __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/ebu[P]libear/submodules/eigen/Eigen/src/Core/CwiseNullaryOp.h"
                    ,0x4a,
                    "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = Eigen::Matrix<double, -1, 1>]"
                   );
    }
    auVar7._8_8_ = 0;
    auVar7._0_8_ = SVar5;
    auVar7 = sqrtpd(auVar7,auVar7);
    uVar3 = local_88.m_rows & 0x7ffffffffffffffe;
    dVar6 = auVar7._0_8_;
    if (1 < local_88.m_rows) {
      uVar4 = 0;
      do {
        auVar2._8_8_ = dVar6;
        auVar2._0_8_ = dVar6;
        auVar7 = divpd(*(undefined1 (*) [16])((double **)local_88.m_data + uVar4),auVar2);
        *(undefined1 (*) [16])((double **)local_88.m_data + uVar4) = auVar7;
        uVar4 = uVar4 + 2;
      } while (uVar4 < uVar3);
    }
    if ((long)uVar3 < local_88.m_rows) {
      do {
        ((double **)local_88.m_data)[uVar3] =
             (double *)((double)((double **)local_88.m_data)[uVar3] / dVar6);
        uVar3 = uVar3 + 1;
      } while (local_88.m_rows != uVar3);
    }
    (__return_storage_ptr__->super_type).m_initialized = false;
    *(double **)&(__return_storage_ptr__->super_type).m_storage.dummy_ = local_88.m_data;
    *(Index *)((long)&(__return_storage_ptr__->super_type).m_storage.dummy_ + 8) = local_88.m_rows;
    local_88.m_data = (double *)0x0;
    local_88.m_rows = 0;
    (__return_storage_ptr__->super_type).m_initialized = true;
  }
  else {
    (__return_storage_ptr__->super_type).m_initialized = false;
  }
  if (local_70[0] == '\x01') {
    free(local_68.m_data);
  }
  return __return_storage_ptr__;
}

Assistant:

boost::optional<Eigen::VectorXd> PointSourcePannerDownmix::handle(
      Eigen::Vector3d position) {
    boost::optional<Eigen::VectorXd> pv = _psp->handle(position);
    if (pv) {
      Eigen::VectorXd _pv = pv.get();
      _pv = _downmix.transpose() * _pv;
      _pv /= _pv.norm();
      return _pv;
    }
    return boost::none;
  }